

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::AncillaryMessage>::~ArrayBuilder(ArrayBuilder<kj::AncillaryMessage> *this)

{
  AncillaryMessage *pAVar1;
  RemoveConst<kj::AncillaryMessage> *pRVar2;
  AncillaryMessage *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (AncillaryMessage *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (AncillaryMessage *)0x0;
    this->pos = (RemoveConst<kj::AncillaryMessage> *)0x0;
    this->endPtr = (AncillaryMessage *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }